

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.hpp
# Opt level: O0

ssize_t __thiscall
jsoncons::stream_source<unsigned_char>::read
          (stream_source<unsigned_char> *this,int __fd,void *__buf,size_t __nbytes)

{
  basic_istream<char,_std::char_traits<char>_> *pbVar1;
  _func_int *p_Var2;
  _Ios_Iostate __a;
  unsigned_long *puVar3;
  ulong uVar4;
  size_type sVar5;
  undefined4 in_register_00000034;
  exception *anon_var_0;
  size_t len2_1;
  streamsize count;
  size_t len2;
  size_t len;
  unsigned_long local_38;
  stream_source<unsigned_char> *in_stack_ffffffffffffffd0;
  size_t __n;
  void *local_28;
  void *local_20;
  void *local_18;
  stream_source<unsigned_char> *local_10;
  void *local_8;
  
  local_18 = (void *)CONCAT44(in_register_00000034,__fd);
  local_28 = (void *)0x0;
  local_20 = __buf;
  local_10 = this;
  if (this->buffer_length_ != 0) {
    puVar3 = std::min<unsigned_long>(&this->buffer_length_,(unsigned_long *)&local_20);
    local_28 = (void *)*puVar3;
    memcpy(local_18,this->buffer_data_,(size_t)local_28);
    this->buffer_data_ = (value_type_conflict *)((long)local_28 + (long)this->buffer_data_);
    this->buffer_length_ = this->buffer_length_ - (long)local_28;
    this->position_ = (long)local_28 + this->position_;
  }
  if (local_20 == local_28) {
    local_8 = local_28;
  }
  else {
    uVar4 = (long)local_20 - (long)local_28;
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->buffer_);
    if (uVar4 < sVar5) {
      fill_buffer(in_stack_ffffffffffffffd0);
      if (this->buffer_length_ != 0) {
        local_38 = (long)local_20 - (long)local_28;
        puVar3 = std::min<unsigned_long>(&this->buffer_length_,&local_38);
        __n = *puVar3;
        memcpy((void *)((long)local_18 + (long)local_28),this->buffer_data_,__n);
        this->buffer_data_ = this->buffer_data_ + __n;
        this->buffer_length_ = this->buffer_length_ - __n;
        this->position_ = __n + this->position_;
        local_28 = (void *)(__n + (long)local_28);
      }
      local_8 = local_28;
    }
    else {
      uVar4 = std::ios::eof();
      if ((uVar4 & 1) == 0) {
        uVar4 = std::streambuf::sgetn((char *)this->sbuf_,(long)local_18 + (long)local_28);
        if (uVar4 < (ulong)((long)local_20 - (long)local_28)) {
          pbVar1 = this->stream_ptr_;
          p_Var2 = pbVar1->_vptr_basic_istream[-3];
          __a = std::ios::rdstate();
          std::operator|(__a,_S_eofbit);
          std::ios::clear((int)pbVar1 + (int)p_Var2);
        }
        local_8 = (void *)(uVar4 + (long)local_28);
        this->position_ = uVar4 + this->position_;
      }
      else {
        this->buffer_length_ = 0;
        local_8 = (void *)0x0;
      }
    }
  }
  return (ssize_t)local_8;
}

Assistant:

std::size_t read(value_type* p, std::size_t length)
        {
            std::size_t len = 0;
            if (buffer_length_ > 0)
            {
                len = (std::min)(buffer_length_, length);
                std::memcpy(p, buffer_data_, len*sizeof(value_type));
                buffer_data_ += len;
                buffer_length_ -= len;
                position_ += len;
            }
            if (length - len == 0)
            {
                return len;
            }
            else if (length - len < buffer_.size())
            {
                fill_buffer();
                if (buffer_length_ > 0)
                {
                    std::size_t len2 = (std::min)(buffer_length_, length-len);
                    std::memcpy(p+len, buffer_data_, len2*sizeof(value_type));
                    buffer_data_ += len2;
                    buffer_length_ -= len2;
                    position_ += len2;
                    len += len2;
                }
                return len;
            }
            else
            {
                if (stream_ptr_->eof())
                {
                    buffer_length_ = 0;
                    return 0;
                }
                JSONCONS_TRY
                {
                    std::streamsize count = sbuf_->sgetn(reinterpret_cast<char_type*>(p+len), length-len);
                    std::size_t len2 = static_cast<std::size_t>(count);
                    if (len2 < length-len)
                    {
                        stream_ptr_->clear(stream_ptr_->rdstate() | std::ios::eofbit);
                    }
                    len += len2;
                    position_ += len2;
                    return len;
                }
                JSONCONS_CATCH(const std::exception&)     
                {
                    stream_ptr_->clear(stream_ptr_->rdstate() | std::ios::badbit | std::ios::eofbit);
                    return 0;
                }
            }